

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O1

void __thiscall S2PaddedCell::S2PaddedCell(S2PaddedCell *this,S2CellId id,double padding)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  int level;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar4;
  int ij [2];
  undefined1 *puStack_a0;
  R2Rect local_98;
  uint local_78;
  uint local_74;
  S2CellId local_70;
  undefined1 local_68 [16];
  R2Point local_58;
  R2Rect local_48;
  
  (this->id_).id_ = id.id_;
  this->padding_ = padding;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)(this->bound_).bounds_[0].bounds_.c_ + lVar3) = 0x3ff0000000000000;
    *(undefined8 *)((long)(this->bound_).bounds_[0].bounds_.c_ + lVar3 + 8) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x20);
  local_70.id_ = id.id_;
  if ((this->bound_).bounds_[1].bounds_.c_[0] <= (this->bound_).bounds_[1].bounds_.c_[1] ==
      (this->bound_).bounds_[0].bounds_.c_[1] < (this->bound_).bounds_[0].bounds_.c_[0]) {
    puStack_a0 = (undefined1 *)0x20771b;
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
               ,0xb1,kFatal,(ostream *)&std::cerr);
    puStack_a0 = (undefined1 *)0x207730;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_98.bounds_[0].bounds_.c_[1],"Check failed: is_valid() ",0x19);
  }
  else {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)(this->middle_).bounds_[0].bounds_.c_ + lVar3) = 0x3ff0000000000000;
      *(undefined8 *)((long)(this->middle_).bounds_[0].bounds_.c_ + lVar3 + 8) = 0;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x20);
    if ((this->middle_).bounds_[1].bounds_.c_[0] <= (this->middle_).bounds_[1].bounds_.c_[1] !=
        (this->middle_).bounds_[0].bounds_.c_[1] < (this->middle_).bounds_[0].bounds_.c_[0]) {
      if ((id.id_ & 0xfffffffffffffff) == 0) {
        lVar3 = 8;
        do {
          *(undefined8 *)((long)&puStack_a0 + lVar3) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_98.bounds_[0].bounds_.c_ + lVar3) = 0;
          lVar3 = lVar3 + 0x10;
        } while (lVar3 != 0x28);
        dVar4 = padding + 1.0;
        (this->bound_).bounds_[0].bounds_.c_[0] = -dVar4;
        (this->bound_).bounds_[0].bounds_.c_[1] = dVar4;
        (this->bound_).bounds_[1].bounds_.c_[0] = -dVar4;
        (this->bound_).bounds_[1].bounds_.c_[1] = dVar4;
        lVar3 = 8;
        do {
          *(undefined8 *)((long)&puStack_a0 + lVar3) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_98.bounds_[0].bounds_.c_ + lVar3) = 0;
          lVar3 = lVar3 + 0x10;
        } while (lVar3 != 0x28);
        (this->middle_).bounds_[0].bounds_.c_[0] = -padding;
        (this->middle_).bounds_[0].bounds_.c_[1] = padding;
        (this->middle_).bounds_[1].bounds_.c_[0] = -padding;
        (this->middle_).bounds_[1].bounds_.c_[1] = padding;
        this->ij_lo_[0] = 0;
        this->ij_lo_[1] = 0;
        this->orientation_ = (uint)(id.id_ >> 0x3d) & 1;
        this->level_ = 0;
      }
      else {
        local_68._8_4_ = in_XMM0_Dc;
        local_68._0_8_ = padding;
        local_68._12_4_ = in_XMM0_Dd;
        puStack_a0 = (undefined1 *)0x20759b;
        S2CellId::ToFaceIJOrientation
                  (&local_70,(int *)&local_78,(int *)&local_74,&this->orientation_);
        if (local_70.id_ == 0) {
          puStack_a0 = (undefined1 *)0x20778f;
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_98,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                     ,0x223,kFatal,(ostream *)&std::cerr);
          puStack_a0 = (undefined1 *)0x2077a4;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_98.bounds_[0].bounds_.c_[1],"Check failed: id_ != 0 ",0x17);
          goto LAB_002077a4;
        }
        uVar1 = 0;
        if (local_70.id_ != 0) {
          for (; (local_70.id_ >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        level = 0x1e - ((uint)(uVar1 >> 1) & 0x7fffffff);
        this->level_ = level;
        puStack_a0 = (undefined1 *)0x2075cc;
        S2CellId::IJLevelToBoundUV(&local_48,(int *)&local_78,level);
        local_58.c_[0] = (VType)local_68._0_8_;
        local_58.c_[1] = (VType)local_68._0_8_;
        puStack_a0 = (undefined1 *)0x2075ed;
        R2Rect::Expanded(&local_98,&local_48,&local_58);
        (this->bound_).bounds_[1].bounds_.c_[0] = local_98.bounds_[1].bounds_.c_[0];
        (this->bound_).bounds_[1].bounds_.c_[1] = local_98.bounds_[1].bounds_.c_[1];
        (this->bound_).bounds_[0].bounds_.c_[0] = local_98.bounds_[0].bounds_.c_[0];
        (this->bound_).bounds_[0].bounds_.c_[1] = local_98.bounds_[0].bounds_.c_[1];
        uVar2 = -1 << (0x1eU - (char)this->level_ & 0x1f);
        this->ij_lo_[0] = local_78 & uVar2;
        this->ij_lo_[1] = uVar2 & local_74;
      }
      return;
    }
    puStack_a0 = (undefined1 *)0x207755;
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
               ,0xb1,kFatal,(ostream *)&std::cerr);
    puStack_a0 = (undefined1 *)0x20776a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_98.bounds_[0].bounds_.c_[1],"Check failed: is_valid() ",0x19);
  }
LAB_002077a4:
  puStack_a0 = &LAB_002077a9;
  abort();
}

Assistant:

S2PaddedCell::S2PaddedCell(S2CellId id, double padding)
    : id_(id), padding_(padding) {
  if (id_.is_face()) {
    // Fast path for constructing a top-level face (the most common case).
    double limit = 1 + padding;
    bound_ = R2Rect(R1Interval(-limit, limit), R1Interval(-limit, limit));
    middle_ = R2Rect(R1Interval(-padding, padding),
                     R1Interval(-padding, padding));
    ij_lo_[0] = ij_lo_[1] = 0;
    orientation_ = id_.face() & 1;
    level_ = 0;
  } else {
    int ij[2];
    id.ToFaceIJOrientation(&ij[0], &ij[1], &orientation_);
    level_ = id.level();
    bound_ = S2CellId::IJLevelToBoundUV(ij, level_).Expanded(padding);
    int ij_size = S2CellId::GetSizeIJ(level_);
    ij_lo_[0] = ij[0] & -ij_size;
    ij_lo_[1] = ij[1] & -ij_size;
  }
}